

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  ImDrawList *pIVar1;
  ImGuiTable *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  ImGuiTableColumn *pIVar8;
  ImVec2 local_c8;
  ImVec2 local_b4;
  undefined1 local_a9;
  bool item_visible;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect bb_1;
  ImGuiOldColumns *columns;
  ImGuiTable *table;
  float x2;
  float x1;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect bb;
  float y2;
  float y1;
  float thickness_layout;
  float thickness_draw;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiSeparatorFlags flags_local;
  
  pIVar6 = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((pIVar6->SkipItems & 1U) == 0) {
    bVar4 = ImIsPowerOfTwo(flags & 3);
    if (!bVar4) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x560,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        table._4_4_ = (pIVar6->Pos).x;
        table._0_4_ = (pIVar6->Pos).x + (pIVar6->Size).x;
        if ((0 < (pIVar3->GroupStack).Size) &&
           (pIVar7 = ImVector<ImGuiGroupData>::back(&pIVar3->GroupStack),
           pIVar7->WindowID == pIVar6->ID)) {
          table._4_4_ = (pIVar6->DC).Indent.x + table._4_4_;
        }
        pIVar2 = pIVar3->CurrentTable;
        if (pIVar2 != (ImGuiTable *)0x0) {
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,pIVar2->CurrentColumn);
          table._4_4_ = pIVar8->MinX;
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,pIVar2->CurrentColumn);
          table._0_4_ = pIVar8->MaxX;
        }
        if ((flags & 4U) == 0) {
          local_c8.x = 0.0;
          local_c8.y = 0.0;
        }
        else {
          local_c8 = (ImVec2)(pIVar6->DC).CurrentColumns;
        }
        bb_1.Max = local_c8;
        if (local_c8 != (ImVec2)0x0) {
          PushColumnsBackground();
        }
        ImVec2::ImVec2(&local_98,table._4_4_,(pIVar6->DC).CursorPos.y);
        ImVec2::ImVec2(&local_a0,table._0_4_,(pIVar6->DC).CursorPos.y + 1.0);
        ImRect::ImRect((ImRect *)local_90,&local_98,&local_a0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff58,0.0,0.0);
        ItemSize((ImVec2 *)&stack0xffffffffffffff58,-1.0);
        local_a9 = ItemAdd((ImRect *)local_90,0,(ImRect *)0x0,0);
        if ((bool)local_a9) {
          pIVar1 = pIVar6->DrawList;
          ImVec2::ImVec2(&local_b4,bb_1.Min.x,(float)local_90._4_4_);
          IVar5 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar1,(ImVec2 *)local_90,&local_b4,IVar5,1.0);
          if ((pIVar3->LogEnabled & 1U) != 0) {
            LogRenderedText((ImVec2 *)local_90,"--------------------------------\n",(char *)0x0);
          }
        }
        if (bb_1.Max != (ImVec2)0x0) {
          PopColumnsBackground();
          *(float *)((long)bb_1.Max + 0x1c) = (pIVar6->DC).CursorPos.y;
        }
      }
    }
    else {
      bb.Max.y = (pIVar6->DC).CursorPos.y;
      bb.Max.x = (pIVar6->DC).CursorPos.y + (pIVar6->DC).CurrLineSize.y;
      ImVec2::ImVec2(&local_48,(pIVar6->DC).CursorPos.x,bb.Max.y);
      ImVec2::ImVec2(&local_50,(pIVar6->DC).CursorPos.x + 1.0,bb.Max.x);
      ImRect::ImRect((ImRect *)local_40,&local_48,&local_50);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      ItemSize(&local_58,-1.0);
      bVar4 = ItemAdd((ImRect *)local_40,0,(ImRect *)0x0,0);
      if (bVar4) {
        pIVar1 = pIVar6->DrawList;
        ImVec2::ImVec2(&local_60,(float)local_40._0_4_,(float)local_40._4_4_);
        ImVec2::ImVec2((ImVec2 *)&x2,(float)local_40._0_4_,bb.Min.y);
        IVar5 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar1,&local_60,(ImVec2 *)&x2,IVar5,1.0);
        if ((pIVar3->LogEnabled & 1U) != 0) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)));   // Check that only 1 option is selected

    float thickness_draw = 1.0f;
    float thickness_layout = 0.0f;
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        // Vertical separator, for menu bars (use current line height). Not exposed because it is misleading and it doesn't have an effect on regular layout.
        float y1 = window->DC.CursorPos.y;
        float y2 = window->DC.CursorPos.y + window->DC.CurrLineSize.y;
        const ImRect bb(ImVec2(window->DC.CursorPos.x, y1), ImVec2(window->DC.CursorPos.x + thickness_draw, y2));
        ItemSize(ImVec2(thickness_layout, 0.0f));
        if (!ItemAdd(bb, 0))
            return;

        // Draw
        window->DrawList->AddLine(ImVec2(bb.Min.x, bb.Min.y), ImVec2(bb.Min.x, bb.Max.y), GetColorU32(ImGuiCol_Separator));
        if (g.LogEnabled)
            LogText(" |");
    }
    else if (flags & ImGuiSeparatorFlags_Horizontal)
    {
        // Horizontal Separator
        float x1 = window->Pos.x;
        float x2 = window->Pos.x + window->Size.x;

        // FIXME-WORKRECT: old hack (#205) until we decide of consistent behavior with WorkRect/Indent and Separator
        if (g.GroupStack.Size > 0 && g.GroupStack.back().WindowID == window->ID)
            x1 += window->DC.Indent.x;

        // FIXME-WORKRECT: In theory we should simply be using WorkRect.Min.x/Max.x everywhere but it isn't aesthetically what we want,
        // need to introduce a variant of WorkRect for that purpose. (#4787)
        if (ImGuiTable* table = g.CurrentTable)
        {
            x1 = table->Columns[table->CurrentColumn].MinX;
            x2 = table->Columns[table->CurrentColumn].MaxX;
        }

        ImGuiOldColumns* columns = (flags & ImGuiSeparatorFlags_SpanAllColumns) ? window->DC.CurrentColumns : NULL;
        if (columns)
            PushColumnsBackground();

        // We don't provide our width to the layout so that it doesn't get feed back into AutoFit
        // FIXME: This prevents ->CursorMaxPos based bounding box evaluation from working (e.g. TableEndCell)
        const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y + thickness_draw));
        ItemSize(ImVec2(0.0f, thickness_layout));
        const bool item_visible = ItemAdd(bb, 0);
        if (item_visible)
        {
            // Draw
            window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x, bb.Min.y), GetColorU32(ImGuiCol_Separator));
            if (g.LogEnabled)
                LogRenderedText(&bb.Min, "--------------------------------\n");

        }
        if (columns)
        {
            PopColumnsBackground();
            columns->LineMinY = window->DC.CursorPos.y;
        }
    }
}